

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void __thiscall pybind11::error_already_set::~error_already_set(error_already_set *this)

{
  bool bVar1;
  handle local_50;
  handle local_48;
  handle local_40;
  undefined1 local_38 [8];
  error_scope scope;
  gil_scoped_acquire gil;
  error_already_set *this_local;
  
  *(undefined ***)this = &PTR__error_already_set_0014fb88;
  bVar1 = handle::operator_cast_to_bool(&(this->m_type).super_handle);
  if (bVar1) {
    gil_scoped_acquire::gil_scoped_acquire((gil_scoped_acquire *)&scope.trace);
    error_scope::error_scope((error_scope *)local_38);
    local_40 = object::release(&this->m_type);
    handle::dec_ref(&local_40);
    local_48 = object::release(&this->m_value);
    handle::dec_ref(&local_48);
    local_50 = object::release(&this->m_trace);
    handle::dec_ref(&local_50);
    error_scope::~error_scope((error_scope *)local_38);
    gil_scoped_acquire::~gil_scoped_acquire((gil_scoped_acquire *)&scope.trace);
  }
  object::~object(&this->m_trace);
  object::~object(&this->m_value);
  object::~object(&this->m_type);
  std::runtime_error::~runtime_error(&this->super_runtime_error);
  return;
}

Assistant:

error_already_set::~error_already_set() {
    if (m_type) {
        gil_scoped_acquire gil;
        error_scope scope;
        m_type.release().dec_ref();
        m_value.release().dec_ref();
        m_trace.release().dec_ref();
    }
}